

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set_inl.h
# Opt level: O3

char * __thiscall
google::protobuf::internal::ExtensionSet::ParseFieldWithExtensionInfo<std::__cxx11::string>
          (ExtensionSet *this,int number,bool was_packed_on_wire,ExtensionInfo *extension,
          InternalMetadata *metadata,char *ptr,ParseContext *ctx)

{
  float value;
  double value_00;
  byte bVar1;
  EnumValidityFuncWithArg *pEVar2;
  uint32_t *data;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  bool bVar6;
  int i;
  int iVar7;
  string *s;
  void *pvVar9;
  char *pcVar10;
  MessageLite *pMVar11;
  long lVar12;
  uint uVar8;
  undefined7 in_register_00000011;
  FieldType FVar13;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s_00;
  uint32_t value_01;
  FieldDescriptor *pFVar14;
  unsigned_long uVar15;
  pair<const_char_*,_int> pVar16;
  pair<const_char_*,_unsigned_long> pVar17;
  pair<const_char_*,_unsigned_long> pVar18;
  pair<const_char_*,_unsigned_long> pVar19;
  pair<const_char_*,_unsigned_long> pVar20;
  pair<const_char_*,_unsigned_long> pVar21;
  pair<const_char_*,_unsigned_long> pVar22;
  void *local_58;
  __uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
  _Stack_50;
  void *pvStack_48;
  InternalMetadata *pIStack_40;
  int local_38;
  undefined1 auVar3 [12];
  
  iVar7 = extension->type - 1;
  if ((int)CONCAT71(in_register_00000011,was_packed_on_wire) != 0) {
    switch(iVar7) {
    case 0:
      pvVar9 = MutableRawRepeatedField
                         (this,number,'\x01',extension->is_packed,extension->descriptor);
      pcVar10 = PackedDoubleParser(pvVar9,ptr,ctx);
      return pcVar10;
    case 1:
      pvVar9 = MutableRawRepeatedField
                         (this,number,'\x02',extension->is_packed,extension->descriptor);
      pcVar10 = PackedFloatParser(pvVar9,ptr,ctx);
      return pcVar10;
    case 2:
      pvVar9 = MutableRawRepeatedField
                         (this,number,'\x03',extension->is_packed,extension->descriptor);
      pcVar10 = PackedInt64Parser(pvVar9,ptr,ctx);
      return pcVar10;
    case 3:
      pvVar9 = MutableRawRepeatedField
                         (this,number,'\x04',extension->is_packed,extension->descriptor);
      pcVar10 = PackedUInt64Parser(pvVar9,ptr,ctx);
      return pcVar10;
    case 4:
      pvVar9 = MutableRawRepeatedField
                         (this,number,'\x05',extension->is_packed,extension->descriptor);
      pcVar10 = PackedInt32Parser(pvVar9,ptr,ctx);
      return pcVar10;
    case 5:
      pvVar9 = MutableRawRepeatedField
                         (this,number,'\x06',extension->is_packed,extension->descriptor);
      pcVar10 = PackedFixed64Parser(pvVar9,ptr,ctx);
      return pcVar10;
    case 6:
      pvVar9 = MutableRawRepeatedField(this,number,'\a',extension->is_packed,extension->descriptor);
      pcVar10 = PackedFixed32Parser(pvVar9,ptr,ctx);
      return pcVar10;
    case 7:
      pvVar9 = MutableRawRepeatedField(this,number,'\b',extension->is_packed,extension->descriptor);
      pcVar10 = PackedBoolParser(pvVar9,ptr,ctx);
      return pcVar10;
    case 8:
    case 9:
    case 10:
    case 0xb:
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_58,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set_inl.h"
                 ,0x37);
      absl::lts_20250127::log_internal::LogMessage::operator<<
                ((LogMessage *)&local_58,(char (*) [37])"Non-primitive types can\'t be packed.");
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_58);
    case 0xc:
      pvVar9 = MutableRawRepeatedField(this,number,'\r',extension->is_packed,extension->descriptor);
      pcVar10 = PackedUInt32Parser(pvVar9,ptr,ctx);
      return pcVar10;
    case 0xd:
      local_58 = MutableRawRepeatedField
                           (this,number,'\x0e',extension->is_packed,extension->descriptor);
      _Stack_50._M_t.
      super__Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
      .super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>.
      _M_head_impl = (tuple<absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
                      )(extension->field_6).enum_validity_check.func;
      pvStack_48 = (extension->field_6).enum_validity_check.arg;
      pIStack_40 = metadata;
      local_38 = number;
      pcVar10 = EpsCopyInputStream::
                ReadPackedVarint<google::protobuf::internal::PackedEnumParserArg<std::__cxx11::string,google::protobuf::internal::ExtensionInfo::EnumValidityCheck>(void*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::ExtensionInfo::EnumValidityCheck,google::protobuf::internal::InternalMetadata*,int)::_lambda(int)_1_,google::protobuf::internal::EpsCopyInputStream::ReadPackedVarint<google::protobuf::internal::PackedEnumParserArg<std::__cxx11::string,google::protobuf::internal::ExtensionInfo::EnumValidityCheck>(void*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::ExtensionInfo::EnumValidityCheck,google::protobuf::internal::InternalMetadata*,int)::_lambda(int)_1_>(char_const*,google::protobuf::internal::PackedEnumParserArg<std::__cxx11::string,google::protobuf::internal::ExtensionInfo::EnumValidityCheck>(void*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::ExtensionInfo::EnumValidityCheck,google::protobuf::internal::InternalMetadata*,int)::_lambda(int)_1_)::_lambda(int)_1_>
                          (&ctx->super_EpsCopyInputStream,ptr);
      return pcVar10;
    case 0xe:
      pvVar9 = MutableRawRepeatedField
                         (this,number,'\x0f',extension->is_packed,extension->descriptor);
      pcVar10 = PackedSFixed32Parser(pvVar9,ptr,ctx);
      return pcVar10;
    case 0xf:
      pvVar9 = MutableRawRepeatedField
                         (this,number,'\x10',extension->is_packed,extension->descriptor);
      pcVar10 = PackedSFixed64Parser(pvVar9,ptr,ctx);
      return pcVar10;
    case 0x10:
      pvVar9 = MutableRawRepeatedField
                         (this,number,'\x11',extension->is_packed,extension->descriptor);
      pcVar10 = PackedSInt32Parser(pvVar9,ptr,ctx);
      return pcVar10;
    case 0x11:
      pvVar9 = MutableRawRepeatedField
                         (this,number,'\x12',extension->is_packed,extension->descriptor);
      pcVar10 = PackedSInt64Parser(pvVar9,ptr,ctx);
      return pcVar10;
    default:
      return ptr;
    }
  }
  switch(iVar7) {
  case 0:
    value_00 = *(double *)ptr;
    ptr = ptr + 8;
    if (extension->is_repeated == true) {
      AddDouble(this,number,'\x01',extension->is_packed,value_00,extension->descriptor);
    }
    else {
      SetDouble(this,number,'\x01',value_00,extension->descriptor);
    }
    break;
  case 1:
    value = *(float *)ptr;
    ptr = ptr + 4;
    if (extension->is_repeated == true) {
      AddFloat(this,number,'\x02',extension->is_packed,value,extension->descriptor);
    }
    else {
      SetFloat(this,number,'\x02',value,extension->descriptor);
    }
    break;
  case 2:
    lVar12 = 0;
    do {
      lVar12 = lVar12 + 1;
    } while (lVar12 != 10);
    bVar1 = *ptr;
    if ((long)(char)bVar1 < 0) {
      pVar18 = VarintParseSlow64(ptr,(uint)bVar1);
      if (pVar18.first == (char *)0x0) goto LAB_00244159;
    }
    else {
      pVar18.second = (long)(char)bVar1;
      pVar18.first = ptr + 1;
    }
    if (extension->is_repeated == true) {
      bVar6 = extension->is_packed;
      pFVar14 = extension->descriptor;
      FVar13 = '\x03';
LAB_002440ff:
      AddInt64(this,number,FVar13,bVar6,pVar18.second,pFVar14);
      return pVar18.first;
    }
    pFVar14 = extension->descriptor;
    FVar13 = '\x03';
    goto LAB_0024411c;
  case 3:
    lVar12 = 0;
    do {
      lVar12 = lVar12 + 1;
    } while (lVar12 != 10);
    bVar1 = *ptr;
    if ((long)(char)bVar1 < 0) {
      pVar19 = VarintParseSlow64(ptr,(uint)bVar1);
      if (pVar19.first == (char *)0x0) goto LAB_00244159;
    }
    else {
      pVar19.second = (long)(char)bVar1;
      pVar19.first = ptr + 1;
    }
    if (extension->is_repeated == true) {
      bVar6 = extension->is_packed;
      pFVar14 = extension->descriptor;
      FVar13 = '\x04';
LAB_00244023:
      AddUInt64(this,number,FVar13,bVar6,pVar19.second,pFVar14);
      return pVar19.first;
    }
    pFVar14 = extension->descriptor;
    FVar13 = '\x04';
    goto LAB_00244040;
  case 4:
    lVar12 = 0;
    do {
      lVar12 = lVar12 + 1;
    } while (lVar12 != 10);
    bVar1 = *ptr;
    if ((long)(char)bVar1 < 0) {
      pVar21 = VarintParseSlow64(ptr,(uint)bVar1);
      auVar3 = pVar21._0_12_;
      if (pVar21.first == (char *)0x0) goto LAB_00244159;
    }
    else {
      auVar5._8_8_ = (long)(char)bVar1;
      auVar5._0_8_ = ptr + 1;
      auVar3 = auVar5._0_12_;
    }
    ptr = auVar3._0_8_;
    uVar8 = auVar3._8_4_;
    if (extension->is_repeated == true) {
      bVar6 = extension->is_packed;
      pFVar14 = extension->descriptor;
      FVar13 = '\x05';
LAB_00243f73:
      AddInt32(this,number,FVar13,bVar6,uVar8,pFVar14);
      return ptr;
    }
    pFVar14 = extension->descriptor;
    FVar13 = '\x05';
    goto LAB_00243f8f;
  case 5:
    pVar19.second = *(unsigned_long *)ptr;
    pVar19.first = ptr + 8;
    if (extension->is_repeated == true) {
      bVar6 = extension->is_packed;
      pFVar14 = extension->descriptor;
      FVar13 = '\x06';
      goto LAB_00244023;
    }
    pFVar14 = extension->descriptor;
    FVar13 = '\x06';
LAB_00244040:
    ptr = pVar19.first;
    SetUInt64(this,number,FVar13,pVar19.second,pFVar14);
    break;
  case 6:
    value_01 = *(uint32_t *)ptr;
    ptr = ptr + 4;
    if (extension->is_repeated == true) {
      bVar6 = extension->is_packed;
      pFVar14 = extension->descriptor;
      FVar13 = '\a';
      goto LAB_00243f12;
    }
    pFVar14 = extension->descriptor;
    FVar13 = '\a';
    goto LAB_00243f2e;
  case 7:
    lVar12 = 0;
    do {
      lVar12 = lVar12 + 1;
    } while (lVar12 != 10);
    bVar1 = *ptr;
    if ((long)(char)bVar1 < 0) {
      pVar20 = VarintParseSlow64(ptr,(uint)bVar1);
      if (pVar20.first == (char *)0x0) goto LAB_00244159;
    }
    else {
      pVar20.second = (long)(char)bVar1;
      pVar20.first = ptr + 1;
    }
    ptr = pVar20.first;
    if (extension->is_repeated == true) {
      AddBool(this,number,'\b',extension->is_packed,pVar20.second != 0,extension->descriptor);
    }
    else {
      SetBool(this,number,'\b',pVar20.second != 0,extension->descriptor);
    }
    break;
  case 8:
  case 0xb:
    if (extension->is_repeated == true) {
      s = AddString_abi_cxx11_(this,number,'\t',extension->descriptor);
    }
    else {
      s = MutableString_abi_cxx11_(this,number,'\t',extension->descriptor);
    }
    bVar1 = *ptr;
    uVar8 = (uint)bVar1;
    if (-1 < (char)bVar1) {
      pcVar10 = ptr + 1;
LAB_00243d72:
      pcVar10 = EpsCopyInputStream::ReadString(&ctx->super_EpsCopyInputStream,pcVar10,uVar8,s);
      return pcVar10;
    }
    pVar16 = ReadSizeFallback(ptr,(uint)bVar1);
    uVar8 = pVar16.second;
    pcVar10 = pVar16.first;
    if (pcVar10 != (char *)0x0) goto LAB_00243d72;
LAB_00244159:
    ptr = (char *)0x0;
    break;
  case 9:
    pMVar11 = (extension->field_6).message_info.prototype;
    if (extension->is_repeated == true) {
      pMVar11 = AddMessage(this,number,'\n',pMVar11,extension->descriptor);
    }
    else {
      pMVar11 = MutableMessage(this,number,'\n',pMVar11,extension->descriptor);
    }
    pcVar10 = ParseContext::ParseGroup(ctx,pMVar11,ptr,number * 8 + 3);
    return pcVar10;
  case 10:
    pMVar11 = (extension->field_6).message_info.prototype;
    if (extension->is_repeated == true) {
      pMVar11 = AddMessage(this,number,'\v',pMVar11,extension->descriptor);
    }
    else {
      pMVar11 = MutableMessage(this,number,'\v',pMVar11,extension->descriptor);
    }
    pcVar10 = ParseContext::ParseMessage(ctx,pMVar11,ptr);
    return pcVar10;
  case 0xc:
    lVar12 = 0;
    do {
      lVar12 = lVar12 + 1;
    } while (lVar12 != 10);
    bVar1 = *ptr;
    if ((long)(char)bVar1 < 0) {
      pVar21 = VarintParseSlow64(ptr,(uint)bVar1);
      auVar3 = pVar21._0_12_;
      if (pVar21.first == (char *)0x0) goto LAB_00244159;
    }
    else {
      auVar4._8_8_ = (long)(char)bVar1;
      auVar4._0_8_ = ptr + 1;
      auVar3 = auVar4._0_12_;
    }
    ptr = auVar3._0_8_;
    value_01 = auVar3._8_4_;
    if (extension->is_repeated == true) {
      bVar6 = extension->is_packed;
      pFVar14 = extension->descriptor;
      FVar13 = '\r';
LAB_00243f12:
      AddUInt32(this,number,FVar13,bVar6,value_01,pFVar14);
      return ptr;
    }
    pFVar14 = extension->descriptor;
    FVar13 = '\r';
LAB_00243f2e:
    SetUInt32(this,number,FVar13,value_01,pFVar14);
    break;
  case 0xd:
    lVar12 = 0;
    do {
      lVar12 = lVar12 + 1;
    } while (lVar12 != 10);
    uVar15 = (unsigned_long)*ptr;
    if ((long)uVar15 < 0) {
      pVar22 = VarintParseSlow64(ptr,(uint)(byte)*ptr);
      uVar15 = pVar22.second;
      if (pVar22.first == (char *)0x0) goto LAB_00244159;
    }
    else {
      pVar22.second = CONCAT71(in_register_00000011,was_packed_on_wire);
      pVar22.first = ptr + 1;
    }
    ptr = pVar22.first;
    pEVar2 = (extension->field_6).enum_validity_check.func;
    data = (uint32_t *)(extension->field_6).enum_validity_check.arg;
    iVar7 = (int)uVar15;
    if (pEVar2 == (EnumValidityFuncWithArg *)0x0) {
      bVar6 = ValidateEnum(iVar7,data);
    }
    else {
      bVar6 = (*pEVar2)(data,iVar7);
    }
    if (bVar6 == false) {
      if ((metadata->ptr_ & 1U) == 0) {
        s_00 = InternalMetadata::mutable_unknown_fields_slow<std::__cxx11::string>(metadata);
      }
      else {
        s_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((metadata->ptr_ & 0xfffffffffffffffeU) + 8);
      }
      WriteVarint(number,(long)iVar7,s_00);
    }
    else if (extension->is_repeated == true) {
      AddEnum(this,number,'\x0e',extension->is_packed,iVar7,extension->descriptor);
    }
    else {
      SetEnum(this,number,'\x0e',iVar7,extension->descriptor);
    }
    break;
  case 0xe:
    uVar8 = *(uint *)ptr;
    ptr = ptr + 4;
    if (extension->is_repeated == true) {
      bVar6 = extension->is_packed;
      pFVar14 = extension->descriptor;
      FVar13 = '\x0f';
      goto LAB_00243f73;
    }
    pFVar14 = extension->descriptor;
    FVar13 = '\x0f';
    goto LAB_00243f8f;
  case 0xf:
    pVar18.second = *(unsigned_long *)ptr;
    pVar18.first = ptr + 8;
    if (extension->is_repeated == true) {
      bVar6 = extension->is_packed;
      pFVar14 = extension->descriptor;
      FVar13 = '\x10';
      goto LAB_002440ff;
    }
    pFVar14 = extension->descriptor;
    FVar13 = '\x10';
    goto LAB_0024411c;
  case 0x10:
    lVar12 = 0;
    do {
      lVar12 = lVar12 + 1;
    } while (lVar12 != 10);
    bVar1 = *ptr;
    if ((long)(char)bVar1 < 0) {
      pVar17 = VarintParseSlow64(ptr,(uint)bVar1);
      if (pVar17.first == (char *)0x0) goto LAB_00244159;
    }
    else {
      pVar17.second = (long)(char)bVar1;
      pVar17.first = ptr + 1;
    }
    ptr = pVar17.first;
    uVar8 = -((uint)pVar17.second & 1) ^ (uint)(pVar17.second >> 1) & 0x7fffffff;
    if (extension->is_repeated == true) {
      bVar6 = extension->is_packed;
      pFVar14 = extension->descriptor;
      FVar13 = '\x11';
      goto LAB_00243f73;
    }
    pFVar14 = extension->descriptor;
    FVar13 = '\x11';
LAB_00243f8f:
    SetInt32(this,number,FVar13,uVar8,pFVar14);
    break;
  case 0x11:
    lVar12 = 0;
    do {
      lVar12 = lVar12 + 1;
    } while (lVar12 != 10);
    bVar1 = *ptr;
    if ((long)(char)bVar1 < 0) {
      pVar21 = VarintParseSlow64(ptr,(uint)bVar1);
      if (pVar21.first == (char *)0x0) goto LAB_00244159;
    }
    else {
      pVar21.second = (long)(char)bVar1;
      pVar21.first = ptr + 1;
    }
    pVar18.second = -(ulong)((uint)pVar21.second & 1) ^ pVar21.second >> 1;
    pVar18.first = pVar21.first;
    if (extension->is_repeated == true) {
      bVar6 = extension->is_packed;
      pFVar14 = extension->descriptor;
      FVar13 = '\x12';
      goto LAB_002440ff;
    }
    pFVar14 = extension->descriptor;
    FVar13 = '\x12';
LAB_0024411c:
    ptr = pVar18.first;
    SetInt64(this,number,FVar13,pVar18.second,pFVar14);
  }
  return ptr;
}

Assistant:

const char* ExtensionSet::ParseFieldWithExtensionInfo(
    int number, bool was_packed_on_wire, const ExtensionInfo& extension,
    InternalMetadata* metadata, const char* ptr, internal::ParseContext* ctx) {
  if (was_packed_on_wire) {
    switch (extension.type) {
#define HANDLE_TYPE(UPPERCASE, CPP_CAMELCASE)                                \
  case WireFormatLite::TYPE_##UPPERCASE:                                     \
    return internal::Packed##CPP_CAMELCASE##Parser(                          \
        MutableRawRepeatedField(number, extension.type, extension.is_packed, \
                                extension.descriptor),                       \
        ptr, ctx);
      HANDLE_TYPE(INT32, Int32);
      HANDLE_TYPE(INT64, Int64);
      HANDLE_TYPE(UINT32, UInt32);
      HANDLE_TYPE(UINT64, UInt64);
      HANDLE_TYPE(SINT32, SInt32);
      HANDLE_TYPE(SINT64, SInt64);
      HANDLE_TYPE(FIXED32, Fixed32);
      HANDLE_TYPE(FIXED64, Fixed64);
      HANDLE_TYPE(SFIXED32, SFixed32);
      HANDLE_TYPE(SFIXED64, SFixed64);
      HANDLE_TYPE(FLOAT, Float);
      HANDLE_TYPE(DOUBLE, Double);
      HANDLE_TYPE(BOOL, Bool);
#undef HANDLE_TYPE

      case WireFormatLite::TYPE_ENUM:
        return internal::PackedEnumParserArg<T>(
            MutableRawRepeatedField(number, extension.type, extension.is_packed,
                                    extension.descriptor),
            ptr, ctx, extension.enum_validity_check, metadata, number);
      case WireFormatLite::TYPE_STRING:
      case WireFormatLite::TYPE_BYTES:
      case WireFormatLite::TYPE_GROUP:
      case WireFormatLite::TYPE_MESSAGE:
        ABSL_LOG(FATAL) << "Non-primitive types can't be packed.";
        break;
    }
  } else {
    switch (extension.type) {
#define HANDLE_VARINT_TYPE(UPPERCASE, CPP_CAMELCASE)                        \
  case WireFormatLite::TYPE_##UPPERCASE: {                                  \
    uint64_t value;                                                         \
    ptr = VarintParse(ptr, &value);                                         \
    GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);                                    \
    if (extension.is_repeated) {                                            \
      Add##CPP_CAMELCASE(number, WireFormatLite::TYPE_##UPPERCASE,          \
                         extension.is_packed, value, extension.descriptor); \
    } else {                                                                \
      Set##CPP_CAMELCASE(number, WireFormatLite::TYPE_##UPPERCASE, value,   \
                         extension.descriptor);                             \
    }                                                                       \
  } break

      HANDLE_VARINT_TYPE(INT32, Int32);
      HANDLE_VARINT_TYPE(INT64, Int64);
      HANDLE_VARINT_TYPE(UINT32, UInt32);
      HANDLE_VARINT_TYPE(UINT64, UInt64);
      HANDLE_VARINT_TYPE(BOOL, Bool);
#undef HANDLE_VARINT_TYPE
#define HANDLE_SVARINT_TYPE(UPPERCASE, CPP_CAMELCASE, SIZE)                 \
  case WireFormatLite::TYPE_##UPPERCASE: {                                  \
    uint64_t val;                                                           \
    ptr = VarintParse(ptr, &val);                                           \
    GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);                                    \
    auto value = WireFormatLite::ZigZagDecode##SIZE(val);                   \
    if (extension.is_repeated) {                                            \
      Add##CPP_CAMELCASE(number, WireFormatLite::TYPE_##UPPERCASE,          \
                         extension.is_packed, value, extension.descriptor); \
    } else {                                                                \
      Set##CPP_CAMELCASE(number, WireFormatLite::TYPE_##UPPERCASE, value,   \
                         extension.descriptor);                             \
    }                                                                       \
  } break

      HANDLE_SVARINT_TYPE(SINT32, Int32, 32);
      HANDLE_SVARINT_TYPE(SINT64, Int64, 64);
#undef HANDLE_SVARINT_TYPE
#define HANDLE_FIXED_TYPE(UPPERCASE, CPP_CAMELCASE, CPPTYPE)                \
  case WireFormatLite::TYPE_##UPPERCASE: {                                  \
    auto value = UnalignedLoad<CPPTYPE>(ptr);                               \
    ptr += sizeof(CPPTYPE);                                                 \
    if (extension.is_repeated) {                                            \
      Add##CPP_CAMELCASE(number, WireFormatLite::TYPE_##UPPERCASE,          \
                         extension.is_packed, value, extension.descriptor); \
    } else {                                                                \
      Set##CPP_CAMELCASE(number, WireFormatLite::TYPE_##UPPERCASE, value,   \
                         extension.descriptor);                             \
    }                                                                       \
  } break

      HANDLE_FIXED_TYPE(FIXED32, UInt32, uint32_t);
      HANDLE_FIXED_TYPE(FIXED64, UInt64, uint64_t);
      HANDLE_FIXED_TYPE(SFIXED32, Int32, int32_t);
      HANDLE_FIXED_TYPE(SFIXED64, Int64, int64_t);
      HANDLE_FIXED_TYPE(FLOAT, Float, float);
      HANDLE_FIXED_TYPE(DOUBLE, Double, double);
#undef HANDLE_FIXED_TYPE

      case WireFormatLite::TYPE_ENUM: {
        uint64_t tmp;
        ptr = VarintParse(ptr, &tmp);
        GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
        int value = tmp;

        if (!extension.enum_validity_check.IsValid(value)) {
          WriteVarint(number, value, metadata->mutable_unknown_fields<T>());
        } else if (extension.is_repeated) {
          AddEnum(number, WireFormatLite::TYPE_ENUM, extension.is_packed, value,
                  extension.descriptor);
        } else {
          SetEnum(number, WireFormatLite::TYPE_ENUM, value,
                  extension.descriptor);
        }
        break;
      }

      case WireFormatLite::TYPE_BYTES:
      case WireFormatLite::TYPE_STRING: {
        std::string* value =
            extension.is_repeated
                ? AddString(number, WireFormatLite::TYPE_STRING,
                            extension.descriptor)
                : MutableString(number, WireFormatLite::TYPE_STRING,
                                extension.descriptor);
        int size = ReadSize(&ptr);
        GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
        return ctx->ReadString(ptr, size, value);
      }

      case WireFormatLite::TYPE_GROUP: {
        MessageLite* value =
            extension.is_repeated
                ? AddMessage(number, WireFormatLite::TYPE_GROUP,
                             *extension.message_info.prototype,
                             extension.descriptor)
                : MutableMessage(number, WireFormatLite::TYPE_GROUP,
                                 *extension.message_info.prototype,
                                 extension.descriptor);
        uint32_t tag = (number << 3) + WireFormatLite::WIRETYPE_START_GROUP;
        return ctx->ParseGroup(value, ptr, tag);
      }

      case WireFormatLite::TYPE_MESSAGE: {
        MessageLite* value =
            extension.is_repeated
                ? AddMessage(number, WireFormatLite::TYPE_MESSAGE,
                             *extension.message_info.prototype,
                             extension.descriptor)
                : MutableMessage(number, WireFormatLite::TYPE_MESSAGE,
                                 *extension.message_info.prototype,
                                 extension.descriptor);
        return ctx->ParseMessage(value, ptr);
      }
    }
  }
  return ptr;
}